

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O1

void bssl::ssl_do_info_callback(SSL *ssl,int type,int value)

{
  _func_void_SSL_ptr_int_int *UNRECOVERED_JUMPTABLE;
  
  UNRECOVERED_JUMPTABLE = ssl->info_callback;
  if (UNRECOVERED_JUMPTABLE == (_func_void_SSL_ptr_int_int *)0x0) {
    UNRECOVERED_JUMPTABLE =
         ((ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->info_callback;
  }
  if (UNRECOVERED_JUMPTABLE != (_func_void_SSL_ptr_int_int *)0x0) {
    (*UNRECOVERED_JUMPTABLE)(ssl,type,value);
    return;
  }
  return;
}

Assistant:

void ssl_do_info_callback(const SSL *ssl, int type, int value) {
  void (*cb)(const SSL *ssl, int type, int value) = NULL;
  if (ssl->info_callback != NULL) {
    cb = ssl->info_callback;
  } else if (ssl->ctx->info_callback != NULL) {
    cb = ssl->ctx->info_callback;
  }

  if (cb != NULL) {
    cb(ssl, type, value);
  }
}